

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::iterate(FlushFinishCase *this)

{
  undefined8 *puVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  float fVar4;
  ExpectedBehavior EVar5;
  TestLog *pTVar6;
  int iVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  int *piVar10;
  pointer pSVar11;
  pointer __src;
  bool bVar12;
  int iVar13;
  int iVar14;
  deUint32 dVar15;
  int iVar16;
  value_type *__val;
  undefined4 extraout_var;
  RenderTarget *pRVar17;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  deUint64 dVar18;
  undefined4 extraout_var_03;
  deUint64 dVar19;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  ostream *poVar20;
  runtime_error *prVar21;
  undefined4 extraout_var_08;
  deUint64 dVar22;
  undefined4 extraout_var_09;
  deUint64 dVar23;
  int *__dest;
  size_t sVar24;
  TestError *this_00;
  uint numDrawCalls;
  uint uVar25;
  int precision;
  long lVar26;
  char *pcVar27;
  int *piVar28;
  ulong uVar29;
  char *__s;
  __normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample_*,_std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>_>
  __i;
  ulong uVar30;
  deUint64 *pdVar31;
  bool bVar32;
  float fVar33;
  LineParameters LVar34;
  undefined1 auVar35 [16];
  float fVar36;
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  samples;
  deUint8 tmp_4 [4];
  ScopedLogSection section_1;
  deUint8 tmp [4];
  size_type __dnew_2;
  ScopedLogSection section;
  deUint8 tmp_2 [4];
  deUint8 tmp_3 [4];
  size_type __dnew_4;
  deUint8 tmp_1 [4];
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> readTimes;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> waitTimes;
  size_type __dnew_5;
  ostringstream msg;
  uint local_66c;
  float fStack_664;
  vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  local_648;
  LogNumber<float> local_630;
  LineParameters local_5c8;
  float fStack_5c0;
  float fStack_5bc;
  ulong local_5b8;
  LogNumber<float> local_5b0;
  string local_548;
  undefined1 local_528 [8];
  undefined1 auStack_520 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_518;
  _Alloc_hider local_508;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4f8;
  _Alloc_hider local_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4d8;
  qpKeyValueTag local_4c8;
  float local_4c4;
  deInt64 local_4c0;
  ios_base local_4b0 [264];
  LogNumber<float> local_3a8;
  pointer local_340;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_218;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_200;
  string local_1e8;
  string local_1c8;
  ostream local_1a8;
  
  local_648.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_648.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_648.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_648.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x640);
  local_648.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_648.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
       ._M_impl.super__Vector_impl_data._M_start + 0x32;
  (local_648.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->waitTime = 0;
  (local_648.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime = 0;
  *(undefined8 *)
   local_648.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start = 0;
  (local_648.
   super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
   ._M_impl.super__Vector_impl_data._M_start)->submitTime = 0;
  lVar26 = 0x20;
  do {
    uVar8 = *(undefined8 *)
             local_648.
             super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    dVar18 = (local_648.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start)->submitTime;
    dVar19 = (local_648.
              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
              ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
    pdVar31 = (deUint64 *)
              ((long)&(local_648.
                       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                       ._M_impl.super__Vector_impl_data._M_start)->waitTime + lVar26);
    *pdVar31 = (local_648.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_start)->waitTime;
    pdVar31[1] = dVar19;
    puVar1 = (undefined8 *)
             ((long)&(local_648.
                      super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                      ._M_impl.super__Vector_impl_data._M_start)->numDrawCalls + lVar26);
    *puVar1 = uVar8;
    puVar1[1] = dVar18;
    lVar26 = lVar26 + 0x20;
  } while (lVar26 != 0x640);
  local_648.
  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_648.
       super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  tcu::warmupCPU();
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar26 = CONCAT44(extraout_var,iVar13);
  iVar14 = (**(code **)(lVar26 + 0x780))((this->m_program->m_program).m_program);
  pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar13 = pRVar17->m_width;
  pRVar17 = Context::getRenderTarget((this->super_TestCase).m_context);
  if (iVar14 < 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"posLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
               ,0xfb);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  iVar16 = pRVar17->m_height;
  if (0xff < iVar16) {
    iVar16 = 0x100;
  }
  iVar7 = 0x100;
  if (iVar13 < 0x100) {
    iVar7 = iVar13;
  }
  (**(code **)(lVar26 + 0x1a00))(0,0,iVar7,iVar16);
  (**(code **)(lVar26 + 0x1680))((this->m_program->m_program).m_program);
  (**(code **)(lVar26 + 0x610))(iVar14);
  (**(code **)(lVar26 + 0x19f0))
            (iVar14,2,0x1406,0,0,
             Functional::(anonymous_namespace)::FlushFinishCase::setupRenderState()::s_positions);
  (**(code **)(lVar26 + 0x5e0))(0xbe2);
  (**(code **)(lVar26 + 0x120))(1,1);
  (**(code **)(lVar26 + 0x100))(0x8006);
  dVar15 = (**(code **)(lVar26 + 0x800))();
  glu::checkError(dVar15,"Failed to set up render state",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
                  ,0x104);
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar13) + 0x14f0))(this->m_iterCountLoc,1);
  render(this,1);
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar13) + 0x1220))(0,0,1,1,0x1908,0x1401,local_528);
  tcu::TestContext::touchWatchdog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_528 = (undefined1  [8])(auStack_520 + 8);
  aStack_518._8_4_ = 0x496e6f69;
  aStack_518._12_3_ = 0x6f666e;
  aStack_518._M_allocated_capacity._0_4_ = 0x696c6143;
  aStack_518._M_allocated_capacity._4_4_ = 0x74617262;
  auStack_520._0_4_ = 0xf;
  auStack_520._4_4_ = 0;
  aStack_518._M_local_buf[0xf] = '\0';
  local_630.m_name._M_dataplus._M_p = (pointer)&local_630.m_name.field_2;
  local_5b0.m_name._M_dataplus._M_p = (pointer)0x10;
  local_630.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_630,(ulong)&local_5b0);
  local_630.m_name.field_2._M_allocated_capacity._0_4_ = SUB84(local_5b0.m_name._M_dataplus._M_p,0);
  local_630.m_name.field_2._M_allocated_capacity._4_4_ =
       (undefined4)((ulong)local_5b0.m_name._M_dataplus._M_p >> 0x20);
  builtin_strncpy(local_630.m_name._M_dataplus._M_p,"Calibration info",0x10);
  local_630.m_name._M_string_length = (size_type)local_5b0.m_name._M_dataplus._M_p;
  local_630.m_name._M_dataplus._M_p[(long)local_5b0.m_name._M_dataplus._M_p] = '\0';
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_338,pTVar6,(string *)local_528,&local_630.m_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630.m_name._M_dataplus._M_p != &local_630.m_name.field_2) {
    operator_delete(local_630.m_name._M_dataplus._M_p,
                    CONCAT44(local_630.m_name.field_2._M_allocated_capacity._4_4_,
                             local_630.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if (local_528 != (undefined1  [8])(auStack_520 + 8)) {
    operator_delete((void *)local_528,
                    CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                             aStack_518._M_allocated_capacity._0_4_) + 1);
  }
  local_528 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_520,"Calibrating shader iteration count, target duration = ",0x36);
  std::ostream::_M_insert<unsigned_long>((ulong)auStack_520);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," us",3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
  std::ios_base::~ios_base(local_4b0);
  iVar14 = 1;
  iVar13 = 1;
  uVar29 = 0;
  do {
    iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_02,iVar16) + 0x14f0))(this->m_iterCountLoc,iVar14);
    render(this,1);
    dVar18 = deGetMicroseconds();
    iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_03,iVar16) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_238);
    dVar19 = deGetMicroseconds();
    local_528 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520,"Duration with ",0xe);
    std::ostream::operator<<((ostringstream *)auStack_520,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," iterations = ",0xe);
    uVar30 = dVar19 - dVar18;
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_520);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," us",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
    std::ios_base::~ios_base(local_4b0);
    if (uVar30 < 0x5dd) {
      if (0x3ff < iVar14) goto LAB_0129749f;
      bVar12 = true;
      iVar16 = iVar14 * 2;
      iVar13 = iVar14;
    }
    else if (iVar14 < 2) {
LAB_0129749f:
      bVar12 = false;
      uVar30 = uVar29;
      iVar16 = iVar14;
    }
    else {
      fVar36 = (float)(uVar30 - uVar29) / (float)(iVar14 - iVar13);
      fVar36 = floorf((1500.0 - ((float)(long)uVar29 - (float)iVar13 * fVar36)) / fVar36);
      iVar16 = (int)fVar36;
      if (0x3ff < iVar16) {
        iVar16 = 0x400;
      }
      if (iVar16 < 2) {
        iVar16 = 1;
      }
      bVar12 = false;
      uVar30 = uVar29;
    }
    iVar14 = iVar16;
    uVar29 = uVar30;
  } while (bVar12);
  pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_630.m_name._M_dataplus._M_p = (pointer)&local_630.m_name.field_2;
  local_630.m_name.field_2._8_4_ = 0x6f437265;
  local_630.m_name.field_2._M_local_buf[0xc] = 'u';
  local_630.m_name.field_2._13_2_ = 0x746e;
  local_630.m_name.field_2._M_allocated_capacity._0_4_ = 0x64616853;
  local_630.m_name.field_2._M_allocated_capacity._4_4_ = 0x74497265;
  local_630.m_name._M_string_length = 0xf;
  local_630.m_name.field_2._M_local_buf[0xf] = '\0';
  local_5b0.m_name._M_dataplus._M_p = (pointer)&local_5b0.m_name.field_2;
  local_3a8.m_name._M_dataplus._M_p = &DAT_00000016;
  local_5b0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_5b0,(ulong)&local_3a8);
  local_5b0.m_name.field_2._M_allocated_capacity = (size_type)local_3a8.m_name._M_dataplus._M_p;
  *(undefined8 *)local_5b0.m_name._M_dataplus._M_p = 0x6920726564616853;
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 8) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 9) = 'e';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 10) = 'r';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0xb) = 'a';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0xc) = 't';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0xd) = 'i';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0xe) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0xf) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0xe) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0xf) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0x10) = ' ';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0x11) = 'c';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0x12) = 'o';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0x13) = 'u';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0x14) = 'n';
  *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5b0.m_name._M_dataplus._M_p + 0x15) = 't';
  local_5b0.m_name._M_string_length = (size_type)local_3a8.m_name._M_dataplus._M_p;
  local_5b0.m_name._M_dataplus._M_p[(long)local_3a8.m_name._M_dataplus._M_p] = '\0';
  local_3a8.m_name._M_dataplus._M_p = (pointer)&local_3a8.m_name.field_2;
  local_3a8.m_name._M_string_length = 0;
  local_3a8.m_name.field_2._M_local_buf[0] = '\0';
  tcu::LogNumber<long>::LogNumber
            ((LogNumber<long> *)local_528,&local_630.m_name,&local_5b0.m_name,&local_3a8.m_name,
             QP_KEY_TAG_NONE,(long)iVar14);
  tcu::TestLog::writeInteger
            (pTVar6,(char *)local_528,local_508._M_p,local_4e8._M_p,local_4c8,local_4c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_p != &local_4d8) {
    operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_508._M_p != &local_4f8) {
    operator_delete(local_508._M_p,local_4f8._M_allocated_capacity + 1);
  }
  if (local_528 != (undefined1  [8])(auStack_520 + 8)) {
    operator_delete((void *)local_528,
                    CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                             aStack_518._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
    operator_delete(local_3a8.m_name._M_dataplus._M_p,
                    CONCAT71(local_3a8.m_name.field_2._M_allocated_capacity._1_7_,
                             local_3a8.m_name.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
    operator_delete(local_5b0.m_name._M_dataplus._M_p,
                    (ulong)(local_5b0.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630.m_name._M_dataplus._M_p != &local_630.m_name.field_2) {
    operator_delete(local_630.m_name._M_dataplus._M_p,
                    CONCAT44(local_630.m_name.field_2._M_allocated_capacity._4_4_,
                             local_630.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  local_528 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)auStack_520,"Calibrating maximum draw call count, target duration = ",0x37);
  std::ostream::operator<<((ostringstream *)auStack_520,150000);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," us",3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
  std::ios_base::~ios_base(local_4b0);
  iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_04,iVar13) + 0x14f0))(this->m_iterCountLoc,iVar14);
  numDrawCalls = 1;
  local_66c = 1;
  uVar29 = 0;
  do {
    render(this,numDrawCalls);
    dVar18 = deGetMicroseconds();
    iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_05,iVar13) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_2b8);
    dVar19 = deGetMicroseconds();
    local_528 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520,"Duration with ",0xe);
    std::ostream::operator<<((ostringstream *)auStack_520,numDrawCalls);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," draw calls = ",0xe);
    uVar30 = dVar19 - dVar18;
    std::ostream::_M_insert<unsigned_long>((ulong)auStack_520);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," us",3);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
    std::ios_base::~ios_base(local_4b0);
    if (uVar30 < 0x249f1) {
      if (0xfffff < (int)numDrawCalls) goto LAB_01297919;
      bVar12 = true;
      uVar25 = numDrawCalls * 2;
      local_66c = numDrawCalls;
    }
    else if ((int)numDrawCalls < 2) {
LAB_01297919:
      bVar12 = false;
      uVar30 = uVar29;
      uVar25 = numDrawCalls;
    }
    else {
      fVar36 = (float)(uVar30 - uVar29) / (float)(int)(numDrawCalls - local_66c);
      fVar36 = floorf((150000.0 - ((float)(long)uVar29 - (float)(int)local_66c * fVar36)) / fVar36);
      uVar25 = (uint)fVar36;
      if (0xfffff < (int)uVar25) {
        uVar25 = 0x100000;
      }
      if ((int)uVar25 < 2) {
        uVar25 = 1;
      }
      bVar12 = false;
      uVar30 = uVar29;
    }
    numDrawCalls = uVar25;
    uVar29 = uVar30;
    if (!bVar12) {
      pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_630.m_name._M_dataplus._M_p = (pointer)&local_630.m_name.field_2;
      local_630.m_name.field_2._M_allocated_capacity._0_4_ = 0x4478614d;
      local_630.m_name.field_2._M_allocated_capacity._4_4_ = 0x43776172;
      local_630.m_name.field_2._8_4_ = 0x736c6c61;
      local_630.m_name._M_string_length = 0xc;
      local_630.m_name.field_2._M_local_buf[0xc] = '\0';
      local_5b0.m_name._M_dataplus._M_p = (pointer)&local_5b0.m_name.field_2;
      local_2f8._M_dataplus._M_p = (pointer)0x1c;
      local_5b0.m_name._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_5b0,(ulong)&local_2f8);
      local_5b0.m_name.field_2._M_allocated_capacity = (size_type)local_2f8._M_dataplus._M_p;
      builtin_strncpy((char *)((long)((long)local_5b0.m_name._M_dataplus._M_p + 8) + 4),"er of dr",8
                     );
      builtin_strncpy((char *)((long)((long)local_5b0.m_name._M_dataplus._M_p + 0x10) + 4),
                      "aw calls",8);
      *(undefined8 *)local_5b0.m_name._M_dataplus._M_p = 0x206d756d6978614d;
      *(undefined8 *)((long)local_5b0.m_name._M_dataplus._M_p + 8) = 0x6f207265626d756e;
      local_5b0.m_name._M_string_length = (size_type)local_2f8._M_dataplus._M_p;
      local_2f8._M_dataplus._M_p[(long)local_5b0.m_name._M_dataplus._M_p] = '\0';
      local_3a8.m_name._M_dataplus._M_p = (pointer)&local_3a8.m_name.field_2;
      local_3a8.m_name._M_string_length = 0;
      local_3a8.m_name.field_2._M_local_buf[0] = '\0';
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)local_528,&local_630.m_name,&local_5b0.m_name,&local_3a8.m_name,
                 QP_KEY_TAG_NONE,(long)(int)numDrawCalls);
      tcu::TestLog::writeInteger
                (pTVar6,(char *)local_528,local_508._M_p,local_4e8._M_p,local_4c8,local_4c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_p != &local_4d8) {
        operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_p != &local_4f8) {
        operator_delete(local_508._M_p,local_4f8._M_allocated_capacity + 1);
      }
      if (local_528 != (undefined1  [8])(auStack_520 + 8)) {
        operator_delete((void *)local_528,
                        CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                 aStack_518._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
        operator_delete(local_3a8.m_name._M_dataplus._M_p,
                        CONCAT71(local_3a8.m_name.field_2._M_allocated_capacity._1_7_,
                                 local_3a8.m_name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
        operator_delete(local_5b0.m_name._M_dataplus._M_p,
                        local_5b0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630.m_name._M_dataplus._M_p != &local_630.m_name.field_2) {
        operator_delete(local_630.m_name._M_dataplus._M_p,
                        CONCAT44(local_630.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_630.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((int)numDrawCalls < 10) {
        prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_528 = (undefined1  [8])(auStack_520 + 8);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_528,"Calibration failed, maximum draw call count is too low","");
        std::runtime_error::runtime_error(prVar21,(string *)local_528);
        *(undefined ***)prVar21 = &PTR__runtime_error_0218deb0;
        __cxa_throw(prVar21,&Functional::(anonymous_namespace)::CalibrationFailedException::typeinfo
                    ,std::runtime_error::~runtime_error);
      }
      tcu::TestLog::endSection((TestLog *)local_338._M_dataplus._M_p);
      iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_06,iVar13) + 0x14f0))(this->m_iterCountLoc,iVar14);
      iVar13 = 3;
      do {
        render(this,numDrawCalls);
        dVar18 = deGetMicroseconds();
        iVar16 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
        (**(code **)(CONCAT44(extraout_var_07,iVar16) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_298);
        dVar19 = deGetMicroseconds();
        lVar26 = dVar19 - dVar18;
        auVar35._8_4_ = (int)((ulong)lVar26 >> 0x20);
        auVar35._0_8_ = lVar26;
        auVar35._12_4_ = 0x45300000;
        fVar36 = (float)(((auVar35._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar26) - 4503599627370496.0)) / 150000.0
                        ) + -1.0;
        if ((fVar36 < -0.1) || (0.1 <= fVar36)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8,"ERROR: Unstable performance, got ",0x21);
          poVar20 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," us read time, ",0xf);
          de::floatToString_abi_cxx11_
                    ((string *)local_528,(de *)&DAT_00000001,fVar36 * 100.0,precision);
          poVar20 = std::__ostream_insert<char,std::char_traits<char>>
                              (poVar20,(char *)local_528,
                               CONCAT44(auStack_520._4_4_,auStack_520._0_4_));
          std::__ostream_insert<char,std::char_traits<char>>(poVar20,"% diff to estimated ",0x14);
          poVar20 = (ostream *)std::ostream::operator<<(poVar20,150000);
          std::__ostream_insert<char,std::char_traits<char>>(poVar20," us",3);
          if (local_528 != (undefined1  [8])(auStack_520 + 8)) {
            operator_delete((void *)local_528,
                            CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                     aStack_518._M_allocated_capacity._0_4_) + 1);
          }
          prVar21 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(prVar21,(string *)local_528);
          *(undefined ***)prVar21 = &PTR__runtime_error_0218deb0;
          __cxa_throw(prVar21,&Functional::(anonymous_namespace)::CalibrationFailedException::
                               typeinfo,std::runtime_error::~runtime_error);
        }
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
      deRandom_init((deRandom *)local_528,0x7b);
      iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
      (**(code **)(CONCAT44(extraout_var_08,iVar13) + 0x14f0))(this->m_iterCountLoc,iVar14);
      pSVar11 = local_648.
                super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      local_340 = local_648.
                  super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_5b8 = (long)local_648.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_648.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start;
      if (local_5b8 != 0) {
        lVar26 = ((long)local_5b8 >> 5) + (ulong)((long)local_5b8 >> 5 == 0);
        pdVar31 = &(local_648.
                    super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                    ._M_impl.super__Vector_impl_data._M_start)->readPixelsTime;
        do {
          dVar15 = deRandom_getUint32((deRandom *)local_528);
          dVar18 = deGetMicroseconds();
          iVar14 = dVar15 % numDrawCalls + 1;
          render(this,iVar14);
          dVar19 = deGetMicroseconds();
          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])();
          dVar22 = deGetMicroseconds();
          iVar13 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
          (**(code **)(CONCAT44(extraout_var_09,iVar13) + 0x1220))(0,0,1,1,0x1908,0x1401,&local_630)
          ;
          dVar23 = deGetMicroseconds();
          ((Sample *)(pdVar31 + -3))->numDrawCalls = iVar14;
          pdVar31[-2] = dVar19 - dVar18;
          pdVar31[-1] = dVar22 - dVar19;
          *pdVar31 = dVar23 - dVar22;
          tcu::TestContext::touchWatchdog
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          pdVar31 = pdVar31 + 4;
          lVar26 = lVar26 + -1;
        } while (lVar26 != 0);
      }
      getPointsFromSamples(&local_200,&local_648,0x10);
      getPointsFromSamples(&local_218,&local_648,0x18);
      uVar29 = local_5b8;
      LVar34 = deqp::gls::theilSenLinearRegression(&local_200);
      local_5c8 = deqp::gls::theilSenLinearRegression(&local_218);
      local_528 = (undefined1  [8])(auStack_520 + 8);
      aStack_518._M_allocated_capacity._0_4_ = 0x706d6153;
      auStack_520._0_4_ = 7;
      auStack_520._4_4_ = 0;
      aStack_518._M_allocated_capacity._4_4_ = 0x73656c;
      paVar3 = &local_630.m_name.field_2;
      local_630.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
      local_630.m_name._M_string_length = 7;
      local_630.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
      local_630.m_name._M_dataplus._M_p = (pointer)paVar3;
      tcu::ScopedLogSection::ScopedLogSection
                ((ScopedLogSection *)&local_5b0,
                 ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                 (string *)local_528,&local_630.m_name);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630.m_name._M_dataplus._M_p != paVar3) {
        operator_delete(local_630.m_name._M_dataplus._M_p,
                        CONCAT44(local_630.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_630.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      __src = local_340;
      if (local_528 != (undefined1  [8])(auStack_520 + 8)) {
        operator_delete((void *)local_528,
                        CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                 aStack_518._M_allocated_capacity._0_4_) + 1);
      }
      if (0x7fffffffffffffe0 < uVar29) {
        std::__throw_length_error("cannot create std::vector larger than max_size()");
      }
      if (pSVar11 == __src) {
        __dest = (int *)0x0;
      }
      else {
        __dest = (int *)operator_new(uVar29);
        memcpy(__dest,__src,uVar29);
        piVar2 = (int *)(uVar29 + (long)__dest);
        lVar26 = 0x3f;
        if (uVar29 >> 5 != 0) {
          for (; (uVar29 >> 5) >> lVar26 == 0; lVar26 = lVar26 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                  (__dest,piVar2,((uint)lVar26 ^ 0x3f) * 2 ^ 0x7e);
        if ((long)uVar29 < 0x201) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                    (__dest,piVar2);
        }
        else {
          piVar28 = __dest + 0x80;
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample*,std::vector<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>>>,__gnu_cxx::__ops::_Iter_comp_iter<deqp::gles3::Functional::(anonymous_namespace)::CompareSampleDrawCount>>
                    (__dest,piVar28);
          do {
            iVar14 = *piVar28;
            uVar8 = *(undefined8 *)(piVar28 + 6);
            aStack_518._M_allocated_capacity._0_4_ =
                 (undefined4)((ulong)*(undefined8 *)(piVar28 + 4) >> 0x20);
            aStack_518._M_allocated_capacity._4_4_ = (undefined4)uVar8;
            aStack_518._8_4_ = (undefined4)((ulong)uVar8 >> 0x20);
            local_528 = *(undefined1 (*) [8])(piVar28 + 1);
            uVar9 = *(undefined8 *)(piVar28 + 3);
            auStack_520._0_4_ = (undefined4)uVar9;
            auStack_520._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
            iVar13 = piVar28[-8];
            piVar10 = piVar28;
            while (iVar14 < iVar13) {
              *(undefined8 *)(piVar10 + 4) = *(undefined8 *)(piVar10 + -4);
              *(undefined8 *)(piVar10 + 6) = *(undefined8 *)(piVar10 + -2);
              *(undefined8 *)piVar10 = *(undefined8 *)(piVar10 + -8);
              *(undefined8 *)(piVar10 + 2) = *(undefined8 *)(piVar10 + -6);
              iVar13 = piVar10[-0x10];
              piVar10 = piVar10 + -8;
            }
            *piVar10 = iVar14;
            *(undefined1 (*) [8])(piVar10 + 1) = local_528;
            *(undefined8 *)(piVar10 + 3) = uVar9;
            *(ulong *)(piVar10 + 4) =
                 CONCAT44(aStack_518._M_allocated_capacity._0_4_,auStack_520._4_4_);
            *(undefined8 *)(piVar10 + 6) = uVar8;
            piVar28 = piVar28 + 8;
          } while (piVar28 != piVar2);
        }
        if (pSVar11 != __src) {
          piVar28 = __dest;
          do {
            local_528 = (undefined1  [8])
                        ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
            std::ostream::operator<<((ostringstream *)auStack_520,*piVar28);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," calls:\t",8)
            ;
            std::ostream::_M_insert<unsigned_long>((ulong)auStack_520);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_520," us submit,\t",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)auStack_520);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)auStack_520," us wait,\t",10);
            std::ostream::_M_insert<unsigned_long>((ulong)auStack_520);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," us read",8);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
            std::ios_base::~ios_base(local_4b0);
            piVar28 = piVar28 + 8;
          } while (piVar28 != piVar2);
        }
      }
      if (__dest != (int *)0x0) {
        operator_delete(__dest,uVar29);
      }
      tcu::TestLog::endSection((TestLog *)local_5b0.m_name._M_dataplus._M_p);
      pTVar6 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
      local_2f8.field_2._M_allocated_capacity._0_7_ = 0x656f4374696157;
      local_2f8.field_2._M_local_buf[7] = 'f';
      local_2f8.field_2._8_7_ = 0x746e6569636966;
      local_2f8._M_string_length = 0xf;
      local_2f8.field_2._M_local_buf[0xf] = '\0';
      local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
      local_630.m_name._M_dataplus._M_p = (char *)0x10;
      local_338._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_338,(ulong)&local_630);
      fStack_664 = LVar34.coefficient;
      local_338.field_2._M_allocated_capacity = (size_type)local_630.m_name._M_dataplus._M_p;
      *(undefined8 *)local_338._M_dataplus._M_p = 0x656f632074696157;
      *(undefined8 *)((long)local_338._M_dataplus._M_p + 8) = 0x746e656963696666;
      local_338._M_string_length = (size_type)local_630.m_name._M_dataplus._M_p;
      local_630.m_name._M_dataplus._M_p[(long)local_338._M_dataplus._M_p] = '\0';
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      local_298._M_string_length = 0;
      local_298.field_2._M_local_buf[0] = '\0';
      tcu::LogNumber<float>::LogNumber
                ((LogNumber<float> *)local_528,&local_2f8,&local_338,&local_298,QP_KEY_TAG_NONE,
                 fStack_664);
      tcu::TestLog::writeFloat
                (pTVar6,(char *)local_528,local_508._M_p,local_4e8._M_p,local_4c8,local_4c4);
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      local_2b8.field_2._M_allocated_capacity._0_7_ = 0x656f4364616552;
      local_2b8.field_2._M_local_buf[7] = 'f';
      local_2b8.field_2._8_7_ = 0x746e6569636966;
      local_2b8._M_string_length = 0xf;
      local_2b8.field_2._M_local_buf[0xf] = '\0';
      local_5b0.m_name._M_dataplus._M_p = (pointer)0x10;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      local_238._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_238,(ulong)&local_5b0);
      local_238.field_2._M_allocated_capacity = (size_type)local_5b0.m_name._M_dataplus._M_p;
      builtin_strncpy(local_238._M_dataplus._M_p,"Read coefficient",0x10);
      local_238._M_string_length = (size_type)local_5b0.m_name._M_dataplus._M_p;
      local_238._M_dataplus._M_p[(long)local_5b0.m_name._M_dataplus._M_p] = '\0';
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      local_258._M_string_length = 0;
      local_258.field_2._M_local_buf[0] = '\0';
      local_5c8.offset = local_5c8.coefficient;
      fStack_5c0 = local_5c8.coefficient;
      fStack_5bc = local_5c8.coefficient;
      tcu::LogNumber<float>::LogNumber
                (&local_630,&local_2b8,&local_238,&local_258,QP_KEY_TAG_NONE,local_5c8.coefficient);
      tcu::TestLog::writeFloat
                (pTVar6,local_630.m_name._M_dataplus._M_p,local_630.m_desc._M_dataplus._M_p,
                 local_630.m_unit._M_dataplus._M_p,local_630.m_tag,local_630.m_value);
      local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
      local_3a8.m_name._M_dataplus._M_p = (pointer)0x19;
      local_548._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_548,(ulong)&local_3a8);
      local_548.field_2._M_allocated_capacity = (size_type)local_3a8.m_name._M_dataplus._M_p;
      builtin_strncpy(local_548._M_dataplus._M_p,"NormalizedWaitCoefficient",0x19);
      local_548._M_string_length = (size_type)local_3a8.m_name._M_dataplus._M_p;
      local_548._M_dataplus._M_p[(long)local_3a8.m_name._M_dataplus._M_p] = '\0';
      local_2d8._M_dataplus._M_p = (pointer)&local_2d8.field_2;
      local_3a8.m_name._M_dataplus._M_p = (char *)0x1b;
      local_2d8._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_2d8,(ulong)&local_3a8);
      fVar36 = (fStack_664 * (float)(int)numDrawCalls) / 150000.0;
      local_2d8.field_2._M_allocated_capacity = (size_type)local_3a8.m_name._M_dataplus._M_p;
      builtin_strncpy(local_2d8._M_dataplus._M_p,"Normalized wait coefficient",0x1b);
      local_2d8._M_string_length = (size_type)local_3a8.m_name._M_dataplus._M_p;
      local_2d8._M_dataplus._M_p[(long)local_3a8.m_name._M_dataplus._M_p] = '\0';
      local_1c8._M_string_length = 0;
      local_1c8.field_2._M_local_buf[0] = '\0';
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      tcu::LogNumber<float>::LogNumber
                (&local_5b0,&local_548,&local_2d8,&local_1c8,QP_KEY_TAG_NONE,fVar36);
      tcu::TestLog::writeFloat
                (pTVar6,local_5b0.m_name._M_dataplus._M_p,local_5b0.m_desc._M_dataplus._M_p,
                 local_5b0.m_unit._M_dataplus._M_p,local_5b0.m_tag,local_5b0.m_value);
      local_278._M_dataplus._M_p = (pointer)0x19;
      local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
      local_318._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_318,(ulong)&local_278);
      local_318.field_2._M_allocated_capacity = (size_type)local_278._M_dataplus._M_p;
      builtin_strncpy(local_318._M_dataplus._M_p,"NormalizedReadCoefficient",0x19);
      local_318._M_string_length = (size_type)local_278._M_dataplus._M_p;
      local_318._M_dataplus._M_p[(long)local_278._M_dataplus._M_p] = '\0';
      local_1e8._M_dataplus._M_p = (pointer)0x1b;
      local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
      local_278._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_278,(ulong)&local_1e8);
      local_5c8.offset = (local_5c8.offset * (float)(int)numDrawCalls) / 150000.0;
      local_278.field_2._M_allocated_capacity = (size_type)local_1e8._M_dataplus._M_p;
      builtin_strncpy(local_278._M_dataplus._M_p,"Normalized read coefficient",0x1b);
      local_278._M_string_length = (size_type)local_1e8._M_dataplus._M_p;
      local_278._M_dataplus._M_p[(long)local_1e8._M_dataplus._M_p] = '\0';
      local_1e8._M_string_length = 0;
      local_1e8.field_2._M_local_buf[0] = '\0';
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
      tcu::LogNumber<float>::LogNumber
                (&local_3a8,&local_318,&local_278,&local_1e8,QP_KEY_TAG_NONE,local_5c8.offset);
      tcu::TestLog::writeFloat
                (pTVar6,local_3a8.m_name._M_dataplus._M_p,local_3a8.m_desc._M_dataplus._M_p,
                 local_3a8.m_unit._M_dataplus._M_p,local_3a8.m_tag,local_3a8.m_value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.m_unit._M_dataplus._M_p != &local_3a8.m_unit.field_2) {
        operator_delete(local_3a8.m_unit._M_dataplus._M_p,
                        local_3a8.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.m_desc._M_dataplus._M_p != &local_3a8.m_desc.field_2) {
        operator_delete(local_3a8.m_desc._M_dataplus._M_p,
                        local_3a8.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3a8.m_name._M_dataplus._M_p != &local_3a8.m_name.field_2) {
        operator_delete(local_3a8.m_name._M_dataplus._M_p,
                        CONCAT71(local_3a8.m_name.field_2._M_allocated_capacity._1_7_,
                                 local_3a8.m_name.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
        operator_delete(local_1e8._M_dataplus._M_p,
                        CONCAT71(local_1e8.field_2._M_allocated_capacity._1_7_,
                                 local_1e8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_278._M_dataplus._M_p != &local_278.field_2) {
        operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_318._M_dataplus._M_p != &local_318.field_2) {
        operator_delete(local_318._M_dataplus._M_p,
                        (ulong)(local_318.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0.m_unit._M_dataplus._M_p != &local_5b0.m_unit.field_2) {
        operator_delete(local_5b0.m_unit._M_dataplus._M_p,
                        local_5b0.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0.m_desc._M_dataplus._M_p != &local_5b0.m_desc.field_2) {
        operator_delete(local_5b0.m_desc._M_dataplus._M_p,
                        local_5b0.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5b0.m_name._M_dataplus._M_p != &local_5b0.m_name.field_2) {
        operator_delete(local_5b0.m_name._M_dataplus._M_p,
                        local_5b0.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p,
                        CONCAT71(local_1c8.field_2._M_allocated_capacity._1_7_,
                                 local_1c8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2d8._M_dataplus._M_p != &local_2d8.field_2) {
        operator_delete(local_2d8._M_dataplus._M_p,
                        (ulong)(local_2d8.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_548._M_dataplus._M_p != &local_548.field_2) {
        operator_delete(local_548._M_dataplus._M_p,
                        (ulong)(local_548.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630.m_unit._M_dataplus._M_p != &local_630.m_unit.field_2) {
        operator_delete(local_630.m_unit._M_dataplus._M_p,
                        local_630.m_unit.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630.m_desc._M_dataplus._M_p != &local_630.m_desc.field_2) {
        operator_delete(local_630.m_desc._M_dataplus._M_p,
                        local_630.m_desc.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630.m_name._M_dataplus._M_p != &local_630.m_name.field_2) {
        operator_delete(local_630.m_name._M_dataplus._M_p,
                        CONCAT44(local_630.m_name.field_2._M_allocated_capacity._4_4_,
                                 local_630.m_name.field_2._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,
                        CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                 local_258.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,
                        CONCAT17(local_2b8.field_2._M_local_buf[7],
                                 local_2b8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8._M_p != &local_4d8) {
        operator_delete(local_4e8._M_p,local_4d8._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_508._M_p != &local_4f8) {
        operator_delete(local_508._M_p,local_4f8._M_allocated_capacity + 1);
      }
      if (local_528 != (undefined1  [8])(auStack_520 + 8)) {
        operator_delete((void *)local_528,
                        CONCAT44(aStack_518._M_allocated_capacity._4_4_,
                                 aStack_518._M_allocated_capacity._0_4_) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,
                        CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                                 local_298.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_338._M_dataplus._M_p != &local_338.field_2) {
        operator_delete(local_338._M_dataplus._M_p,
                        (ulong)(local_338.field_2._M_allocated_capacity + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
        operator_delete(local_2f8._M_dataplus._M_p,
                        CONCAT17(local_2f8.field_2._M_local_buf[7],
                                 local_2f8.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if ((0.5 < fVar36) || (fVar36 < 0.1)) {
        local_528 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520,"Wait time is",0xc);
        pcVar27 = " NOT";
        if (0.5 < fVar36) {
          pcVar27 = glcts::fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520,pcVar27,(ulong)(fVar36 <= 0.5) << 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520," correlated to rendering workload size.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_528 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520,
                   "Warning: Wait time correlation to rendering workload size is unclear.",0x45);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
      std::ios_base::~ios_base(local_4b0);
      if ((0.5 < local_5c8.offset) || (local_5c8.offset < 0.1)) {
        local_528 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520,"Read time is",0xc);
        pcVar27 = " NOT";
        if (0.5 < local_5c8.offset) {
          pcVar27 = glcts::fixed_sample_locations_values + 1;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520,pcVar27,(ulong)(local_5c8.offset <= 0.5) << 2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520," correlated to rendering workload size.",0x27);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      else {
        local_528 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)auStack_520,
                   "Warning: Read time correlation to rendering workload size is unclear.",0x45);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
      std::ios_base::~ios_base(local_4b0);
      iVar13 = 0;
      bVar12 = true;
      do {
        bVar32 = iVar13 != 0;
        fVar33 = fVar36;
        if (bVar32) {
          fVar33 = local_5c8.offset;
        }
        pcVar27 = "render and read";
        if (!bVar32) {
          pcVar27 = "Finish and wait";
        }
        EVar5 = (&this->m_waitBehavior)[(ulong)bVar32 * 2];
        fVar4 = (&this->m_waitThreshold)[(ulong)bVar32 * 2];
        if (EVar5 == EXPECT_COEF_GREATER_THAN) {
          bVar32 = fVar4 < fVar33;
        }
        else {
          bVar32 = fVar33 < fVar4 && EVar5 == EXPECT_COEF_LESS_THAN;
        }
        __s = "less than";
        if (EVar5 != EXPECT_COEF_LESS_THAN) {
          __s = (char *)0x0;
        }
        if (EVar5 == EXPECT_COEF_GREATER_THAN) {
          __s = "greater than";
        }
        if (!bVar32) {
          local_528 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)auStack_520);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_520,"ERROR: Expected ",0x10);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520,pcVar27 + 0xb,4)
          ;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)auStack_520," coefficient to be ",0x13);
          if (__s == (char *)0x0) {
            std::ios::clear((int)auStack_520 +
                            (int)*(undefined8 *)
                                  (CONCAT44(auStack_520._4_4_,auStack_520._0_4_) + -0x18));
          }
          else {
            sVar24 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520,__s,sVar24);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)auStack_520," ",1);
          std::ostream::_M_insert<double>((double)fVar4);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_528,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)auStack_520);
          std::ios_base::~ios_base(local_4b0);
          bVar12 = false;
        }
        iVar13 = iVar13 + 1;
      } while (iVar13 == 1);
      pcVar27 = "Suspicious performance behavior";
      if (bVar12) {
        pcVar27 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 (byte)~bVar12 & QP_TEST_RESULT_FAIL,pcVar27);
      if (local_218.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_218.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_218.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_218.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_200.
          super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>._M_impl
          .super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_200.
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_200.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_200.
                              super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      if (local_648.
          super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_648.
                        super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_648.
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_648.
                              super__Vector_base<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::FlushFinishCase::Sample>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      return STOP;
    }
  } while( true );
}

Assistant:

FlushFinishCase::IterateResult FlushFinishCase::iterate (void)
{
	vector<Sample>		samples		(NUM_SAMPLES);
	CalibrationParams	params;

	tcu::warmupCPU();

	setupRenderState();

	// Do one full render cycle.
	{
		setShaderIterCount(1);
		render(1);
		readPixels();
	}

	// Calibrate.
	for (int calibrationRoundNdx = 0; /* until done */; calibrationRoundNdx++)
	{
		try
		{
			m_testCtx.touchWatchdog();
			params = calibrate();
			verifyCalibration(params);
			break;
		}
		catch (const CalibrationFailedException& e)
		{
			m_testCtx.getLog() << e;

			if (calibrationRoundNdx < MAX_CALIBRATION_ATTEMPTS)
			{
				m_testCtx.getLog() << TestLog::Message
								   << "Retrying calibration (" << (calibrationRoundNdx+1) << " / " << (int)MAX_CALIBRATION_ATTEMPTS << ")"
								   << TestLog::EndMessage;
			}
			else
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_COMPATIBILITY_WARNING, e.what());
				return STOP;
			}
		}
	}

	// Do measurement.
	{
		de::Random	rnd		(123);

		setShaderIterCount(params.numItersInShader);

		for (size_t ndx = 0; ndx < samples.size(); ndx++)
		{
			const int		drawCallCount	= rnd.getInt(1, params.maxDrawCalls);
			const deUint64	submitStartTime	= deGetMicroseconds();
			deUint64		waitStartTime;
			deUint64		readStartTime;
			deUint64		readFinishTime;

			render(drawCallCount);

			waitStartTime = deGetMicroseconds();
			waitForGL();

			readStartTime = deGetMicroseconds();
			readPixels();
			readFinishTime = deGetMicroseconds();

			samples[ndx].numDrawCalls	= drawCallCount;
			samples[ndx].submitTime		= waitStartTime-submitStartTime;
			samples[ndx].waitTime		= readStartTime-waitStartTime;
			samples[ndx].readPixelsTime	= readFinishTime-readStartTime;

			m_testCtx.touchWatchdog();
		}
	}

	// Analyze - sets test case result.
	analyzeResults(samples, params);

	return STOP;
}